

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  pointer piVar4;
  pointer pLVar5;
  cmGeneratorTarget *this_00;
  TargetType TVar6;
  _Elt_pointer pBVar7;
  SharedDepEntry *dep;
  pointer piVar8;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar9;
  BFSEntry qe;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> emmitted;
  int local_64;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  AddDirectLinkEntries(this);
  pBVar7 = (this->BFSQueue).c.
           super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->BFSQueue).c.
      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar7) {
    do {
      uVar1 = pBVar7->Index;
      pcVar3 = pBVar7->LibDepends;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      pop_front(&(this->BFSQueue).c);
      qe._4_4_ = 0;
      qe.Index = uVar1;
      qe.LibDepends = pcVar3;
      FollowLinkEntry(this,qe);
      pBVar7 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->BFSQueue).c.
             super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar7);
  }
  dep = (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->SharedDepQueue).c.
      super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    do {
      HandleSharedDependency(this,dep);
      std::
      deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
      ::pop_front(&(this->SharedDepQueue).c);
      dep = (this->SharedDepQueue).c.
            super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->SharedDepQueue).c.
             super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep);
  }
  InferDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    Compute(this);
  }
  OrderLinkEntires(this);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar4 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (piVar8 != piVar4) {
    do {
      iVar2 = piVar8[-1];
      pLVar5 = (this->EntryList).
               super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = pLVar5[iVar2].Target;
      local_64 = iVar2;
      if (this_00 == (cmGeneratorTarget *)0x0) {
LAB_003bed0c:
        std::
        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
        push_back(&this->FinalLinkEntries,pLVar5 + iVar2);
      }
      else {
        TVar6 = cmGeneratorTarget::GetType(this_00);
        if (TVar6 != SHARED_LIBRARY) goto LAB_003bed0c;
        pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_60,&local_64);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_003bed0c;
      }
      piVar8 = piVar8 + -1;
    } while (piVar8 != piVar4);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
            ((this->FinalLinkEntries).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->FinalLinkEntries).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (this->DebugMode == true) {
    DisplayFinalEntries(this);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return &this->FinalLinkEntries;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the final ordering.
  this->OrderLinkEntires();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emmitted;
  for (int i : cmReverseRange(this->FinalLinkOrder)) {
    LinkEntry const& e = this->EntryList[i];
    cmGeneratorTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmStateEnums::SHARED_LIBRARY;
    if (!uniquify || emmitted.insert(i).second) {
      this->FinalLinkEntries.push_back(e);
    }
  }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}